

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void SelfTest(bool verbose)

{
  bool bVar1;
  byte in_DIL;
  HashInfo *info_1;
  size_t i_1;
  HashInfo *info;
  size_t i;
  bool pass;
  ulong local_20;
  ulong local_10;
  bool local_2;
  
  local_2 = true;
  for (local_10 = 0; local_10 < 0x96; local_10 = local_10 + 1) {
    if ((in_DIL & 1) != 0) {
      printf("%20s - ",g_hashes[local_10].name);
    }
    bVar1 = VerificationTest((pfHash)i,info._4_4_,(uint32_t)info,i_1._7_1_);
    local_2 = (local_2 & bVar1) != 0;
  }
  if (local_2 != false) {
    return;
  }
  printf("Self-test FAILED!\n");
  if ((in_DIL & 1) == 0) {
    for (local_20 = 0; local_20 < 0x96; local_20 = local_20 + 1) {
      printf("%20s - ",g_hashes[local_20].name);
      VerificationTest((pfHash)i,info._4_4_,(uint32_t)info,i_1._7_1_);
    }
  }
  exit(1);
}

Assistant:

void SelfTest(bool verbose) {
  bool pass = true;
  for (size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
    HashInfo *info = &g_hashes[i];
    if (verbose)
      printf("%20s - ", info->name);
    pass &= VerificationTest(info->hash, info->hashbits, info->verification,
                             verbose);
  }

  if (!pass) {
    printf("Self-test FAILED!\n");
    if (!verbose) {
      for (size_t i = 0; i < sizeof(g_hashes) / sizeof(HashInfo); i++) {
        HashInfo *info = &g_hashes[i];
        printf("%20s - ", info->name);
        pass &= VerificationTest(info->hash, info->hashbits, info->verification,
                                 true);
      }
    }
    exit(1);
  }
}